

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

bool __thiscall FIX::SessionState::withinHeartBeat(SessionState *this,UtcTimeStamp *now)

{
  int iVar1;
  int iVar2;
  DateTime *pDVar3;
  IntField *pIVar4;
  undefined1 local_19;
  UtcTimeStamp *now_local;
  SessionState *this_local;
  
  pDVar3 = &lastSentTime(this)->super_DateTime;
  iVar1 = FIX::operator-(&now->super_DateTime,pDVar3);
  pIVar4 = &heartBtInt(this)->super_IntField;
  iVar2 = IntField::operator_cast_to_int(pIVar4);
  local_19 = false;
  if (iVar1 < iVar2) {
    pDVar3 = &lastReceivedTime(this)->super_DateTime;
    iVar1 = FIX::operator-(&now->super_DateTime,pDVar3);
    pIVar4 = &heartBtInt(this)->super_IntField;
    iVar2 = IntField::operator_cast_to_int(pIVar4);
    local_19 = iVar1 < iVar2;
  }
  return local_19;
}

Assistant:

bool withinHeartBeat(const UtcTimeStamp &now) const {
    return ((now - lastSentTime()) < heartBtInt()) && ((now - lastReceivedTime()) < heartBtInt());
  }